

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O2

vector<Vec2,_std::allocator<Vec2>_> * __thiscall
Router::Route(vector<Vec2,_std::allocator<Vec2>_> *__return_storage_ptr__,Router *this,Vec2 start,
             Vec2 end)

{
  uint uVar1;
  pointer pVVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int u;
  long lVar14;
  float fVar15;
  float fVar16;
  float local_a388;
  float fStack_a384;
  float local_a368;
  float fStack_a364;
  Vec2 end_local;
  bool used [100];
  float dis [100];
  Vec2 vertex [100];
  int prev [100];
  float edges [100] [100];
  
  (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  end_local = end;
  bVar4 = Reachable(this,end);
  if (bVar4) {
    local_a368 = end.x;
    fStack_a364 = end.y;
    local_a388 = start.x;
    fStack_a384 = start.y;
    if (0.0001 <= SQRT((local_a368 - local_a388) * (local_a368 - local_a388) +
                       (fStack_a364 - fStack_a384) * (fStack_a364 - fStack_a384))) {
      uVar1 = this->VertexCount;
      lVar12 = (long)(int)uVar1;
      uVar9 = 0;
      memset(vertex,0,800);
      pVVar2 = (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = 0;
      if (0 < (int)uVar1) {
        uVar6 = (ulong)uVar1;
      }
      for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
        vertex[uVar9] = pVVar2[uVar9];
      }
      uVar6 = lVar12 + 1;
      vertex[lVar12] = start;
      uVar7 = uVar1 + 2;
      uVar9 = 0;
      if (0 < (int)uVar7) {
        uVar9 = (ulong)uVar7;
      }
      vertex[lVar12 + 1] = end;
      lVar12 = 1;
      uVar11 = 0;
      while (uVar11 != uVar9) {
        prev[uVar11] = -1;
        used[uVar11] = false;
        fVar15 = 0.0;
        if (uVar11 != (uint)this->VertexCount) {
          fVar15 = 1e+08;
        }
        *(undefined4 *)((long)edges + uVar11 * 0x194) = 0;
        dis[uVar11] = fVar15;
        for (lVar10 = lVar12; (int)lVar10 < (int)uVar7; lVar10 = lVar10 + 1) {
          if ((long)uVar11 < (long)this->VertexCount && (int)lVar10 < this->VertexCount) {
            fVar15 = *(float *)(*(long *)&(this->Edges).
                                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data + lVar10 * 4);
          }
          else {
            for (lVar14 = 0; lVar14 < this->ObstacleCount; lVar14 = lVar14 + 1) {
              lVar13 = 1;
              while (lVar13 != 5) {
                lVar3 = *(long *)&(this->Obstacles).
                                  super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar14].
                                  super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                                  super__Vector_impl_data;
                bVar4 = intersect(vertex[uVar11],vertex[lVar10],*(Vec2 *)(lVar3 + -8 + lVar13 * 8),
                                  *(Vec2 *)(lVar3 + (ulong)((uint)lVar13 & 3) * 8));
                lVar13 = lVar13 + 1;
                if (bVar4) {
                  fVar15 = 1e+08;
                  goto LAB_0010738e;
                }
              }
            }
            fVar15 = vertex[uVar11].x - vertex[lVar10].x;
            fVar16 = vertex[uVar11].y - vertex[lVar10].y;
            fVar15 = SQRT(fVar15 * fVar15 + fVar16 * fVar16);
          }
LAB_0010738e:
          edges[lVar10][uVar11] = fVar15;
          edges[uVar11][lVar10] = fVar15;
        }
        lVar12 = lVar12 + 1;
        uVar11 = uVar11 + 1;
      }
      uVar8 = 0;
      uVar11 = 0xffffffff;
      while( true ) {
        while( true ) {
          iVar5 = (int)uVar11;
          if (uVar8 == uVar9) break;
          if ((used[uVar8] == false) &&
             ((iVar5 == -1 || (dis[uVar8] <= dis[iVar5] && dis[iVar5] != dis[uVar8])))) {
            uVar11 = uVar8 & 0xffffffff;
          }
          uVar8 = uVar8 + 1;
        }
        if (iVar5 == -1) break;
        used[iVar5] = true;
        for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
          fVar15 = dis[iVar5] + edges[iVar5][uVar11];
          if (fVar15 < dis[uVar11]) {
            dis[uVar11] = fVar15;
            prev[uVar11] = iVar5;
          }
        }
        uVar8 = 0;
        uVar11 = 0xffffffff;
      }
      while (uVar7 = (uint)uVar6, uVar7 != uVar1) {
        std::vector<Vec2,_std::allocator<Vec2>_>::push_back
                  (__return_storage_ptr__,vertex + (int)uVar7);
        uVar6 = (ulong)(uint)prev[(int)uVar7];
      }
      std::__reverse<__gnu_cxx::__normal_iterator<Vec2*,std::vector<Vec2,std::allocator<Vec2>>>>
                ((__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    else {
      std::vector<Vec2,_std::allocator<Vec2>_>::push_back(__return_storage_ptr__,&end_local);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vec2> Router::Route(Vec2 start, Vec2 end)
{
    std::vector<Vec2> res;
    if (!Reachable(end))
        return res;
    if ((end - start).length() < EPS)
    {
        res.push_back(end);
        return res;
    }

    int Points = VertexCount;

    float dis[MAX_POINTS];					//起点到该点的最短距离
	float edges[MAX_POINTS][MAX_POINTS];    //边权
	Vec2 vertex[MAX_POINTS];			    //参与最短路计算的点的坐标
	int prev[MAX_POINTS];					//点的前驱，回溯最短路用
	bool used[MAX_POINTS];                  //点是否已松弛过

    for (int i = 0; i < Points; ++i)
        vertex[i] = Vertexes[i];
    vertex[Points++] = start;
    vertex[Points++] = end;

    for (int i = 0; i < Points; ++i)
    {
        prev[i] = -1;
        used[i] = false;
        dis[i] = (i == VertexCount ? 0 : FINF);
        edges[i][i] = 0;
        for (int j = i + 1; j < Points; ++j)
        {
            if (i < VertexCount && j < VertexCount)
            {
                edges[i][j] = edges[j][i] = Edges[i][j];
                continue;
            }
            bool flag = true;
            for (int u = 0; u < ObstacleCount; ++u)
            {
                for (int v = 0; v < 4; ++v)
                    if (intersect(vertex[i], vertex[j], Obstacles[u][v], Obstacles[u][(v + 1) & 3]))
                    {
						flag = false;
                        break;
                    }
                if (!flag)
                    break;
            }
            edges[i][j] = edges[j][i] = (flag ? (vertex[i] - vertex[j]).length() : FINF);
        }
    }

    //Dijkstra
    while (true)
    {
        int v = -1;
        for (int i = 0; i < Points; ++i)
            if (!used[i] && (v == -1 || dis[i] < dis[v]))
                v = i;
		if (v == -1)
            break;
        used[v] = true;
        for (int i = 0; i < Points; ++i)
            if (dis[i] > dis[v] + edges[v][i])
            {
                dis[i] = dis[v] + edges[v][i];
                prev[i] = v;
            }
    }

	for (int i = Points - 1; i != Points - 2; i = prev[i])
        res.push_back(vertex[i]);
    reverse(res.begin(), res.end());
    return res;
}